

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixUtils.cpp
# Opt level: O2

set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *
getDivisors(set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *__return_storage_ptr__
           ,longlong num)

{
  _Rb_tree_header *p_Var1;
  int i;
  ulong uVar2;
  ulong uVar3;
  ulong local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar3 = -num;
  if (0 < num) {
    uVar3 = num;
  }
  for (uVar2 = 1; uVar2 * uVar2 <= uVar3; uVar2 = uVar2 + 1) {
    if (num % (long)uVar2 == 0) {
      local_38 = uVar2;
      std::
      _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
      ::_M_insert_unique<long_long>(&__return_storage_ptr__->_M_t,(longlong *)&local_38);
      local_38 = num / (long)uVar2;
      std::
      _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
      ::_M_insert_unique<long_long>(&__return_storage_ptr__->_M_t,(longlong *)&local_38);
    }
  }
  local_38 = uVar3;
  std::
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  ::_M_insert_unique<long_long>(&__return_storage_ptr__->_M_t,(longlong *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

set<long long int> getDivisors(long long int num) {
    set<long long int> divisors;
    for(int i = 1; i * i <= abs(num); i++) {
        if(num % i == 0) {
            divisors.insert(i);
            divisors.insert(num / i);
        }
    }
    divisors.insert(abs(num));
    return divisors;
}